

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::toString(double in)

{
  String *in_RDI;
  int in_stack_000001f4;
  double in_stack_000001f8;
  
  anon_unknown_14::fpToString<double>(in_stack_000001f8,in_stack_000001f4);
  return in_RDI;
}

Assistant:

String toString(double in) { return fpToString(in, 10); }